

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_0::createPoolNullParamsTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deUint32 queueFamilyIndex;
  VkDevice device;
  DeviceInterface *vk;
  long *local_68;
  long local_60;
  long local_58 [2];
  Move<vk::Handle<(vk::HandleType)24>_> local_48;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  ::vk::createCommandPool(&local_48,vk,device,0,queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  if (local_48.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&local_48.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkCommandPool)
               local_48.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  }
  local_48.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_48.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_48.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  local_48.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Command Pool allocated correctly.","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_68,local_60 + (long)local_68);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createPoolNullParamsTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	createCommandPool(vk, vkDevice, 0u, queueFamilyIndex);

	return tcu::TestStatus::pass("Command Pool allocated correctly.");
}